

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O0

void EncodeFrameSBG(uchar *frame,int *pframelen,uchar mid,uchar mclass,uchar *payload,int len)

{
  uint16 uVar1;
  uint16 crc;
  int offset;
  int len_local;
  uchar *payload_local;
  uchar mclass_local;
  uchar mid_local;
  int *pframelen_local;
  uchar *frame_local;
  
  *frame = 0xff;
  frame[1] = 'Z';
  frame[2] = mid;
  frame[3] = mclass;
  frame[4] = (uchar)len;
  frame[5] = (uchar)((uint)len >> 8);
  memcpy(frame + 6,payload,(long)len);
  uVar1 = CalcCRCSBG(frame + 2,(short)(len + 6) - 2);
  frame[len + 6] = (uchar)uVar1;
  frame[len + 7] = (uchar)(uVar1 >> 8);
  frame[len + 8] = '3';
  *pframelen = len + 9;
  return;
}

Assistant:

inline void EncodeFrameSBG(unsigned char* frame, int* pframelen, unsigned char mid, unsigned char mclass, unsigned char* payload, int len)
{
	int offset = 0;
	uint16 crc = 0;

	frame[0] = (unsigned char)SYNC1_SBG;
	frame[1] = (unsigned char)SYNC2_SBG;
	frame[2] = (unsigned char)mid;
	frame[3] = (unsigned char)mclass;
	frame[4] = (unsigned char)(len&0xFF);
	frame[5] = (unsigned char)(len>>8);
	offset = FRAME_HEADER_LEN_SBG;
	memcpy(frame+offset, payload, len);
	offset += len;
	crc = CalcCRCSBG(frame+2, (uint16)(offset-2));
	frame[offset] = (unsigned char)(crc&0xFF);
	offset++;
	frame[offset] = (unsigned char)(crc>>8);
	offset++;
	frame[offset] = (unsigned char)ETX_SBG;
	*pframelen = len+MIN_FRAME_LEN_SBG;
}